

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QByteArray,QByteArray>::emplace<QByteArray_const&>
          (QHash<QByteArray,_QByteArray> *this,QByteArray *key,QByteArray *args)

{
  long lVar1;
  bool bVar2;
  QByteArray *in_RSI;
  QHash<QByteArray,_QByteArray> *in_RDI;
  long in_FS_OFFSET;
  QHash<QByteArray,_QByteArray> copy;
  QByteArray *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffff90;
  QByteArray *in_stack_ffffffffffffff98;
  QByteArray *in_stack_ffffffffffffffa0;
  piter local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QHash<QByteArray,_QByteArray>::isDetached
                    ((QHash<QByteArray,_QByteArray> *)in_stack_ffffffffffffff90);
  if (bVar2) {
    bVar2 = QHashPrivate::Data<QHashPrivate::Node<QByteArray,_QByteArray>_>::shouldGrow(in_RDI->d);
    if (bVar2) {
      QByteArray::QByteArray(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      local_38 = (piter)QHash<QByteArray,_QByteArray>::emplace_helper<QByteArray>
                                  (in_RDI,in_RSI,in_stack_ffffffffffffff98);
      QByteArray::~QByteArray((QByteArray *)0x322c4e);
    }
    else {
      local_38 = (piter)emplace_helper<QByteArray_const&>
                                  (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  else {
    QHash<QByteArray,_QByteArray>::QHash
              ((QHash<QByteArray,_QByteArray> *)in_stack_ffffffffffffff90,
               (QHash<QByteArray,_QByteArray> *)in_stack_ffffffffffffff88);
    QHash<QByteArray,_QByteArray>::detach
              ((QHash<QByteArray,_QByteArray> *)in_stack_ffffffffffffff90);
    local_38 = (piter)emplace_helper<QByteArray_const&>
                                (in_RDI,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    QHash<QByteArray,_QByteArray>::~QHash
              ((QHash<QByteArray,_QByteArray> *)in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (iterator)local_38;
  }
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }